

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  SymbolIndex SVar1;
  Symbol *this_00;
  _func_void_intptr_t_Compilation_ptr_ClassType_ptr *p_Var2;
  span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> parameterDecls;
  int iVar3;
  Compilation *args;
  ClassType *pCVar4;
  Scope *pSVar5;
  ParameterSymbolBase *pPVar6;
  ParameterSymbol *this_01;
  TypeParameterSymbol *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar8;
  ClassDeclarationSyntax *syntax_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  size_type extraout_RDX_04;
  pointer decl;
  Type **args_00;
  long lVar9;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_00;
  SourceRange referencingRange;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_00;
  ClassType *classType;
  Scope *local_258;
  SpecializationKey key;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  ParameterBuilder paramBuilder;
  
  args = ASTContext::getCompilation(context);
  pSVar5 = (this->super_Symbol).parentScope;
  if (pSVar5 == (Scope *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ClassSymbols.cpp"
               ,0x307,
               "const Type *slang::ast::GenericClassDefSymbol::getSpecializationImpl(const ASTContext &, SourceLocation, bool, const ParameterValueAssignmentSyntax *) const"
              );
  }
  pCVar4 = BumpAllocator::
           emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                     (&args->super_BumpAllocator,args,&(this->super_Symbol).name,
                      &(this->super_Symbol).location);
  pCVar4->genericClass = this;
  SVar1 = (this->super_Symbol).indexInScope;
  (pCVar4->super_Type).super_Symbol.parentScope = pSVar5;
  (pCVar4->super_Type).super_Symbol.indexInScope = SVar1;
  classType = pCVar4;
  local_258 = pSVar5;
  pSVar5 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  parameterDecls.data_ =
       (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_;
  parameterDecls.size_ =
       (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len;
  ParameterBuilder::ParameterBuilder(&paramBuilder,pSVar5,(this->super_Symbol).name,parameterDecls);
  paramBuilder.suppressErrors = syntax == (ParameterValueAssignmentSyntax *)0x0;
  src = extraout_RDX;
  paramBuilder.instanceContext = context;
  paramBuilder.forceInvalidValues = forceInvalidParams;
  if (!paramBuilder.suppressErrors) {
    ParameterBuilder::setAssignments(&paramBuilder,syntax);
    src = extraout_RDX_00;
  }
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_ =
       (pointer)paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.firstElement;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.len = 0;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.cap = 5;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_ =
       (pointer)typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.firstElement;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.len = 0;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.cap = 5;
  decl = (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_;
  lVar9 = (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len * 0x30
  ;
  do {
    if (lVar9 == 0) {
      iVar3 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                        (&paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>,
                         (EVP_PKEY_CTX *)args,src);
      paramValues_00.data_._4_4_ = extraout_var;
      paramValues_00.data_._0_4_ = iVar3;
      iVar3 = SmallVectorBase<const_slang::ast::Type_*>::copy
                        (&typeParams.super_SmallVectorBase<const_slang::ast::Type_*>,
                         (EVP_PKEY_CTX *)args,src_00);
      typeParams_00.data_._4_4_ = extraout_var_00;
      typeParams_00.data_._0_4_ = iVar3;
      paramValues_00.size_ = (size_type)src_00;
      typeParams_00.size_ = extraout_RDX_04;
      SpecializationKey::SpecializationKey(&key,this,paramValues_00,typeParams_00);
      iVar8 = ska::detailv3::
              sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
              ::find(&(this->specMap).
                      super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                     ,&key);
      pCVar4 = classType;
      if (iVar8.current ==
          (this->specMap).
          super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
          .entries +
          (this->specMap).
          super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
          .num_slots_minus_one +
          (long)(this->specMap).
                super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                .max_lookups) {
        p_Var2 = (this->specializeFunc).callback;
        if (p_Var2 == (_func_void_intptr_t_Compilation_ptr_ClassType_ptr *)0x0) {
          syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>
                                ((this->super_Symbol).originatingSyntax);
          ClassType::populate(pCVar4,local_258,syntax_00);
        }
        else {
          (*p_Var2)((this->specializeFunc).callable,args,classType);
        }
        args_00 = (Type **)&classType;
        ska::detailv3::
        sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
        ::emplace<slang::ast::GenericClassDefSymbol::SpecializationKey&,slang::ast::ClassType*&>
                  ((sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
                    *)&this->specMap,&key,(ClassType **)args_00);
      }
      else {
        args_00 = &((iVar8.current)->field_1).value.second;
      }
      pCVar4 = (ClassType *)*args_00;
LAB_0032c78d:
      SmallVectorBase<const_slang::ast::Type_*>::~SmallVectorBase
                (&typeParams.super_SmallVectorBase<const_slang::ast::Type_*>);
      SmallVectorBase<const_slang::ConstantValue_*>::~SmallVectorBase
                (&paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>);
      ska::detailv3::
      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
      ::~sherwood_v3_table
                (&paramBuilder.assignments.
                  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
                  .
                  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
                );
      return &pCVar4->super_Type;
    }
    pPVar6 = ParameterBuilder::createParam(&paramBuilder,decl,&pCVar4->super_Scope,instanceLoc);
    if (paramBuilder.anyErrors == true) {
      if (syntax == (ParameterValueAssignmentSyntax *)0x0) {
        pCVar4 = (ClassType *)0x0;
      }
      else {
        pCVar4 = (ClassType *)args->errorType;
      }
      goto LAB_0032c78d;
    }
    src = extraout_RDX_01;
    if (pPVar6->isLocal == false) {
      this_00 = pPVar6->symbol;
      if (this_00->kind == Parameter) {
        this_01 = Symbol::as<slang::ast::ParameterSymbol>(this_00);
        referencingRange.endLoc =
             (SourceLocation)
             ((long)instanceLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
             (ulong)(instanceLoc._0_4_ & 0xfffffff));
        referencingRange.startLoc = instanceLoc;
        key.definition =
             (GenericClassDefSymbol *)ParameterSymbol::getValue(this_01,referencingRange);
        SmallVectorBase<slang::ConstantValue_const*>::emplace_back<slang::ConstantValue_const*>
                  ((SmallVectorBase<slang::ConstantValue_const*> *)&paramValues,
                   (ConstantValue **)&key);
        src = extraout_RDX_02;
      }
      else {
        pTVar7 = Symbol::as<slang::ast::TypeParameterSymbol>(this_00);
        key.definition = (GenericClassDefSymbol *)DeclaredType::getType(&pTVar7->targetType);
        SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                  ((SmallVectorBase<slang::ast::Type_const*> *)&typeParams,(Type **)&key);
        src = extraout_RDX_03;
      }
    }
    decl = decl + 1;
    lVar9 = lVar9 + -0x30;
  } while( true );
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    ASSERT(scope);

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    SpecializationKey key(*this, paramValues.copy(comp), typeParams.copy(comp));
    if (auto it = specMap.find(key); it != specMap.end())
        return it->second;

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());
    specMap.emplace(key, classType);
    return classType;
}